

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

uint P_GetPortal(int type,int plane,sector_t *from,sector_t *to,DVector2 *displacement)

{
  FSectorPortal *pFVar1;
  double dVar2;
  FSectorPortal *pFVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  TArray<FSectorPortal,_FSectorPortal>::Grow(&sectorPortals,1);
  uVar4 = sectorPortals.Count;
  pFVar3 = sectorPortals.Array;
  uVar5 = (ulong)sectorPortals.Count;
  sectorPortals.Count = sectorPortals.Count + 1;
  pFVar1 = sectorPortals.Array + uVar5;
  pFVar1->mType = 0;
  pFVar1->mFlags = 0;
  pFVar1->mPartner = 0;
  pFVar1->mPlane = 0;
  pFVar3[uVar5].mOrigin = (sector_t *)0x0;
  (&pFVar3[uVar5].mOrigin)[1] = (sector_t *)0x0;
  pFVar3[uVar5].mPlaneZ = 0.0;
  *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar3[uVar5].mPlaneZ + 1) =
       (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  pFVar3[uVar5].mDisplacement.X = 0.0;
  pFVar3[uVar5].mDisplacement.Y = 0.0;
  pFVar3[uVar5].mType = type;
  pFVar3[uVar5].mPlane = plane;
  pFVar3[uVar5].mOrigin = from;
  pFVar3[uVar5].mDestination = to;
  dVar2 = displacement->Y;
  pFVar3[uVar5].mDisplacement.X = displacement->X;
  pFVar3[uVar5].mDisplacement.Y = dVar2;
  if (type == 3) {
    dVar2 = from->planes[plane].TexZ;
    uVar6 = SUB84(dVar2,0);
    uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    uVar6 = 0xe0000000;
    uVar7 = 0x47efffff;
  }
  pFVar3[uVar5].mPlaneZ = (double)CONCAT44(uVar7,uVar6);
  return uVar4;
}

Assistant:

unsigned P_GetPortal(int type, int plane, sector_t *from, sector_t *to, const DVector2 &displacement)
{
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = type;
	sectorPortals[i].mPlane = plane;
	sectorPortals[i].mOrigin = from;
	sectorPortals[i].mDestination = to;
	sectorPortals[i].mDisplacement = displacement;
	sectorPortals[i].mPlaneZ = type == PORTS_LINKEDPORTAL? from->GetPlaneTexZ(plane) : FLT_MAX;
	return i;
}